

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVertexTriangleAdjacency.cpp
# Opt level: O1

void __thiscall VTAdjacencyTest::checkMesh(VTAdjacencyTest *this,aiMesh *mesh)

{
  uint uVar1;
  aiFace *paVar2;
  bool bVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  char *pcVar7;
  char *in_R9;
  uint qq;
  long lVar8;
  uint uVar9;
  AssertionResult gtest_ar_;
  uint tt;
  AssertionResult gtest_ar;
  uint num;
  VertexTriangleAdjacency adj;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertHelper local_98;
  uint local_8c;
  string local_88;
  aiMesh *local_68;
  AssertHelper local_60;
  ulong local_58;
  VertexTriangleAdjacency local_50;
  
  Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency
            (&local_50,mesh->mFaces,mesh->mNumFaces,mesh->mNumVertices,true);
  local_68 = mesh;
  if (mesh->mNumFaces == 0) {
    uVar9 = 0;
  }
  else {
    uVar6 = 0;
    uVar9 = 0;
    do {
      paVar2 = local_68->mFaces;
      lVar8 = 0;
      do {
        uVar1 = paVar2[uVar6].mIndices[lVar8];
        local_60.data_._0_4_ = local_50.mLiveTriangles[uVar1];
        uVar1 = local_50.mOffsetTable[uVar1];
        if (uVar9 < uVar1 + (uint)local_60.data_) {
          uVar9 = uVar1 + (uint)local_60.data_;
        }
        local_8c = 0;
        if ((uint)local_60.data_ != 0) {
          lVar4 = 0;
          do {
            if (uVar6 == local_50.mAdjacencyTable[(ulong)uVar1 + lVar4]) {
              local_50.mAdjacencyTable[(ulong)uVar1 + lVar4] = 0xffffffff;
              break;
            }
            lVar4 = lVar4 + 1;
            local_8c = (uint)lVar4;
          } while ((uint)local_60.data_ != local_8c);
        }
        testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                  ((internal *)&local_88,"tt","num",&local_8c,(uint *)&local_60);
        if ((char)local_88._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_a8);
          pcVar7 = "";
          if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
            pcVar7 = *(char **)local_88._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                     ,0xc4,pcVar7);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          if (local_a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_a8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_a8.ptr_ + 8))();
            }
            local_a8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_88._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_68->mNumFaces);
  }
  if (uVar9 != 0) {
    puVar5 = local_50.mAdjacencyTable;
    do {
      local_a8.ptr_._0_4_ = 0xffffffff;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&local_88,"0xffffffff","*pi",(uint *)&local_a8,puVar5);
      if ((char)local_88._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        pcVar7 = "";
        if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
          pcVar7 = *(char **)local_88._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                   ,0xcc,pcVar7);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_a8.ptr_ + 8))();
          }
          local_a8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_88._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      puVar5 = puVar5 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (local_68->mNumFaces != 0) {
    uVar6 = 0;
    do {
      paVar2 = local_68->mFaces;
      lVar8 = 0;
      local_58 = uVar6;
      do {
        local_a8.ptr_ = local_a8.ptr_ & 0xffffffff00000000;
        puVar5 = local_50.mLiveTriangles + paVar2[uVar6].mIndices[lVar8];
        testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                  ((internal *)&local_88,"0U","piNum[idx]",(uint *)&local_a8,puVar5);
        if ((char)local_88._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_a8);
          pcVar7 = "";
          if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
            pcVar7 = *(char **)local_88._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                     ,0xd8,pcVar7);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          if (local_a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_a8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_a8.ptr_ + 8))();
            }
            local_a8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_88._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        *puVar5 = *puVar5 - 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      uVar6 = local_58 + 1;
    } while (uVar6 < local_68->mNumFaces);
  }
  if (local_68->mNumVertices != 0) {
    uVar6 = 0;
    do {
      local_a8.ptr_._0_1_ = local_50.mLiveTriangles[uVar6] == 0;
      local_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_50.mLiveTriangles[uVar6] != 0) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_88,(internal *)&local_a8,(AssertionResult *)"piNum[i]","true","false",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                   ,0xe0,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                          (char)local_88._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
            &local_88.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p))
          ;
        }
        if (local_98.data_ != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (local_98.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_98.data_ + 8))();
          }
          local_98.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_68->mNumVertices);
  }
  Assimp::VertexTriangleAdjacency::~VertexTriangleAdjacency(&local_50);
  return;
}

Assistant:

void VTAdjacencyTest::checkMesh(const aiMesh& mesh)
{
    VertexTriangleAdjacency adj(mesh.mFaces,mesh.mNumFaces,mesh.mNumVertices,true);

    unsigned int* const piNum = adj.mLiveTriangles;

    // check the primary adjacency table and check whether all faces
    // are contained in the list
    unsigned int maxOfs = 0;
    for (unsigned int i = 0; i < mesh.mNumFaces;++i)
    {
        aiFace& face = mesh.mFaces[i];
        for (unsigned int qq = 0; qq < 3 ;++qq)
        {
            const unsigned int idx = face.mIndices[qq];
            const unsigned int num = piNum[idx];

            // go to this offset
            const unsigned int ofs = adj.mOffsetTable[idx];
            maxOfs = std::max(ofs+num,maxOfs);
            unsigned int* pi = &adj.mAdjacencyTable[ofs];

            // and search for us ...
            unsigned int tt = 0;
            for (; tt < num;++tt,++pi)
            {
                if (i == *pi)
                {
                    // mask our entry in the table. Finally all entries should be masked
                    *pi = 0xffffffff;

                    // there shouldn't be two entries for the same face
                    break;
                }
            }
            // assert if *this* vertex has not been found in the table
            EXPECT_LT(tt, num);
        }
    }

    // now check whether there are invalid faces
    const unsigned int* pi = adj.mAdjacencyTable;
    for (unsigned int i = 0; i < maxOfs;++i,++pi)
    {
        EXPECT_EQ(0xffffffff, *pi);
    }

    // check the numTrianglesPerVertex table
    for (unsigned int i = 0; i < mesh.mNumFaces;++i)
    {
        aiFace& face = mesh.mFaces[i];
        for (unsigned int qq = 0; qq < 3 ;++qq)
        {
            const unsigned int idx = face.mIndices[qq];

            // we should not reach 0 here ...
            EXPECT_NE(0U, piNum[idx]);
            piNum[idx]--;
        }
    }

    // check whether we reached 0 in all entries
    for (unsigned int i = 0; i < mesh.mNumVertices;++i)
    {
        EXPECT_FALSE(piNum[i]);
    }
}